

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O1

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
::semiintersect_iterator
          (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
           *this,iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *first,
          iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *last,size_t min_items)

{
  __normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  _Var1;
  
  (this->m_begin)._M_current = first;
  (this->m_end)._M_current = last;
  this->m_min_items = min_items;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,__gnu_cxx::__ops::_Iter_negate<burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,std::less<void>>::semiintersect_iterator(__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>,unsigned_long,std::less<void>)::_lambda(auto:1_const&)_1_>>
                    (first,last,this);
  if (_Var1._M_current != last) {
    __assert_fail("std::all_of(m_begin, m_end, [this] (const auto & range) { return boost::algorithm::is_sorted(range, m_compare); })"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                  ,0x84,
                  "burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>>>>::semiintersect_iterator(outer_range_iterator, outer_range_iterator, std::size_t, Compare) [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>>>, Compare = std::less<void>]"
                 );
  }
  if (min_items != 0) {
    settle(this);
    return;
  }
  __assert_fail(anon_var_dwarf_49e2bb,
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                ,0x85,
                "burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>>>>::semiintersect_iterator(outer_range_iterator, outer_range_iterator, std::size_t, Compare) [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>>>, Compare = std::less<void>]"
               );
}

Assistant:

semiintersect_iterator
            (
                outer_range_iterator first, outer_range_iterator last,
                std::size_t min_items,
                Compare compare = Compare()
            ):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_min_items(min_items),
            m_compare(compare)
        {
            BOOST_ASSERT(std::all_of(m_begin, m_end,
                [this] (const auto & range)
                {
                    return boost::algorithm::is_sorted(range, m_compare);
                }));
            BOOST_ASSERT_MSG(min_items > 0, "Невозможно получить полупересечение из нуля элементов.");

            settle();
        }